

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O0

void __thiscall
node::BlockAssembler::addPackageTxs
          (BlockAssembler *this,CTxMemPool *mempool,int *nPackagesSelected,int *nDescendantsUpdated)

{
  iterator position;
  iterator position_00;
  string_view calling_fn_name;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  CAmount CVar6;
  CTxMemPool *mempool_00;
  _Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  mapModifiedTx_00;
  CTxMemPoolModifiedEntry *pCVar7;
  int *in_RCX;
  int *in_RDX;
  setEntries *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  pair<std::_Rb_tree_const_iterator<transaction_identifier<false>_>,_bool> pVar9;
  pair<std::_Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>,_bool>
  pVar10;
  size_t i;
  int64_t packageSigOpsCost;
  CAmount packageFees;
  uint64_t packageSize;
  bool fUsingModified;
  int64_t nConsecutiveFailed;
  int64_t MAX_CONSECUTIVE_FAILURES;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  sortedEntries;
  modtxscoreiter modit;
  type it;
  txiter iter;
  iterator mi;
  setEntries ancestors;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  failedTx;
  indexed_modified_transaction_set mapModifiedTx;
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  CTxMemPoolEntry *in_stack_fffffffffffffbd0;
  txiter in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  uint32_t in_stack_fffffffffffffbe4;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
  in_stack_fffffffffffffbe8;
  CTxMemPoolModifiedEntry *in_stack_fffffffffffffbf0;
  CTxMemPoolModifiedEntry *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  _Rb_tree_const_iterator<transaction_identifier<false>_> in_stack_fffffffffffffc08;
  iterator in_stack_fffffffffffffc20;
  undefined6 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2e;
  undefined1 in_stack_fffffffffffffc2f;
  setEntries *alreadyAdded;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  _Rb_tree_const_iterator<transaction_identifier<false>_> in_stack_fffffffffffffc50;
  BlockAssembler *in_stack_fffffffffffffc80;
  CTxMemPoolModifiedEntry *in_stack_fffffffffffffc88;
  txiter in_stack_fffffffffffffce8;
  bool local_2fa;
  byte local_282;
  CTxMemPoolModifiedEntry *local_278;
  long local_250;
  long local_238;
  CTxMemPoolModifiedEntry local_1f0;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
  *local_1c8;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
  *local_180;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *local_168;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
  *local_138;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
  *local_130;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *local_128;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
  *local_120;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
  *local_118;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *local_f0;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
  *local_e8;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *local_e0;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
  *local_d8;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
  *local_d0;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *local_c8;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
  *local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  _Base_ptr local_98;
  undefined1 local_90;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffbd8.node,(char *)in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbcc,(AnnotatedMixin<std::recursive_mutex> *)0x4a2440);
  boost::multi_index::
  multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
  ::multi_index_container
            ((multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
              *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  boost::multi_index::
  multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
  ::get<ancestor_score>
            ((multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
              *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_c0 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
              *)boost::multi_index::detail::
                ordered_index_impl<boost::multi_index::identity<CTxMemPoolEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<5,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                ::begin((ordered_index_impl<boost::multi_index::identity<CTxMemPoolEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<5,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                         *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  boost::multi_index::detail::
  hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
  ::hashed_index_iterator
            ((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
              *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_238 = 0;
LAB_004a24a2:
  boost::multi_index::
  multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
  ::get<ancestor_score>
            ((multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
              *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_d0 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
              *)boost::multi_index::detail::
                ordered_index_impl<boost::multi_index::identity<CTxMemPoolEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<5,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                ::end((ordered_index_impl<boost::multi_index::identity<CTxMemPoolEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<5,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                       *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  bVar1 = boost::operators_impl::operator!=
                    ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                      *)in_stack_fffffffffffffbd8.node,
                     (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                      *)in_stack_fffffffffffffbd0);
  local_282 = 1;
  if (!bVar1) {
    bVar1 = boost::multi_index::detail::
            ordered_index_impl<node::modifiedentry_iter,_node::CompareCTxMemPoolIter,_boost::multi_index::detail::nth_layer<1,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
            ::empty((ordered_index_impl<node::modifiedentry_iter,_node::CompareCTxMemPoolIter,_boost::multi_index::detail::nth_layer<1,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                     *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_282 = bVar1 ^ 0xff;
  }
  if ((local_282 & 1) == 0) goto LAB_004a328a;
  boost::multi_index::
  multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
  ::get<ancestor_score>
            ((multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
              *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_d8 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
              *)boost::multi_index::detail::
                ordered_index_impl<boost::multi_index::identity<CTxMemPoolEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<5,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                ::end((ordered_index_impl<boost::multi_index::identity<CTxMemPoolEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<5,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                       *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  bVar1 = boost::operators_impl::operator!=
                    ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                      *)in_stack_fffffffffffffbd8.node,
                     (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                      *)in_stack_fffffffffffffbd0);
  if (bVar1) {
    local_e8 = local_c0;
    local_e0 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                *)boost::multi_index::
                  multi_index_container<CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>
                  ::
                  project<0,boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>
                            (in_stack_fffffffffffffbd8.node,in_stack_fffffffffffffbe8);
    local_f0 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                *)boost::multi_index::detail::
                  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                  ::end((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                         *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    bVar1 = boost::operators_impl::operator!=
                      ((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                        *)in_stack_fffffffffffffbd8.node,
                       (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                        *)in_stack_fffffffffffffbd0);
    if (!bVar1) {
      __assert_fail("it != mempool.mapTx.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/miner.cpp"
                    ,0x146,
                    "void node::BlockAssembler::addPackageTxs(const CTxMemPool &, int &, int &)");
    }
    bVar2 = false;
    bVar1 = false;
    sVar3 = boost::multi_index::detail::
            ordered_index_impl<node::modifiedentry_iter,node::CompareCTxMemPoolIter,boost::multi_index::detail::nth_layer<1,node::CTxMemPoolModifiedEntry,node::CTxMemPoolModifiedEntry_Indices,std::allocator<node::CTxMemPoolModifiedEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
            ::
            count<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>
                      ((ordered_index_impl<node::modifiedentry_iter,_node::CompareCTxMemPoolIter,_boost::multi_index::detail::nth_layer<1,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                        *)in_stack_fffffffffffffbd8.node,
                       (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                        *)in_stack_fffffffffffffbd0);
    bVar8 = true;
    if (sVar3 == 0) {
      boost::operators_impl::
      dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
      ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                    *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      CTxMemPoolEntry::GetSharedTx(in_stack_fffffffffffffbd0);
      bVar2 = true;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      sVar5 = std::
              unordered_set<transaction_identifier<false>,_SaltedTxidHasher,_std::equal_to<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              ::count((unordered_set<transaction_identifier<false>,_SaltedTxidHasher,_std::equal_to<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                       *)in_stack_fffffffffffffbd8.node,(key_type *)in_stack_fffffffffffffbd0);
      bVar8 = true;
      if (sVar5 == 0) {
        boost::operators_impl::
        dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
        ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                      *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        CTxMemPoolEntry::GetSharedTx(in_stack_fffffffffffffbd0);
        bVar1 = true;
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        CTransaction::GetHash
                  ((CTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        sVar4 = std::
                set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                ::count((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                         *)in_stack_fffffffffffffbd8.node,(key_type *)in_stack_fffffffffffffbd0);
        bVar8 = sVar4 != 0;
      }
    }
    if (bVar1) {
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)
                 CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    }
    if (bVar2) {
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)
                 CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    }
    if (bVar8) {
      boost::multi_index::detail::
      bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
      ::operator++((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      goto LAB_004a24a2;
    }
  }
  boost::multi_index::
  multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
  ::get<ancestor_score>
            ((multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
              *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_118 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
               *)boost::multi_index::detail::
                 ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                 ::begin((ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                          *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  boost::multi_index::
  multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
  ::get<ancestor_score>
            ((multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
              *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_120 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
               *)boost::multi_index::detail::
                 ordered_index_impl<boost::multi_index::identity<CTxMemPoolEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<5,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                 ::end((ordered_index_impl<boost::multi_index::identity<CTxMemPoolEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<5,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                        *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  bVar1 = boost::multi_index::detail::operator==
                    ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                      *)in_stack_fffffffffffffbd8.node,
                     (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                      *)in_stack_fffffffffffffbd0);
  if (bVar1) {
    pCVar7 = boost::operators_impl::
             dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
             ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
                           *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_c8 = (pCVar7->iter).node;
    bVar1 = true;
  }
  else {
    local_130 = local_c0;
    local_128 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                 *)boost::multi_index::
                   multi_index_container<CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>
                   ::
                   project<0,boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>
                             (in_stack_fffffffffffffbd8.node,in_stack_fffffffffffffbe8);
    local_c8 = local_128;
    boost::multi_index::
    multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
    ::get<ancestor_score>
              ((multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
                *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_138 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>
                 *)boost::multi_index::detail::
                   ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                   ::end((ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                          *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    bVar1 = boost::operators_impl::operator!=
                      ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>
                        *)in_stack_fffffffffffffbd8.node,
                       (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>
                        *)in_stack_fffffffffffffbd0);
    local_2fa = false;
    if (bVar1) {
      boost::multi_index::detail::
      bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>
      ::operator*((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      local_168 = local_c8;
      CTxMemPoolModifiedEntry::CTxMemPoolModifiedEntry
                ((CTxMemPoolModifiedEntry *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbd8);
      local_2fa = CompareTxMemPoolEntryByAncestorFee::operator()
                            ((CompareTxMemPoolEntryByAncestorFee *)
                             CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                             in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    }
    bVar1 = local_2fa != false;
    if (bVar1) {
      in_stack_fffffffffffffce8.node =
           (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
            *)boost::operators_impl::
              dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
              ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
                            *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      local_c8 = *(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                   **)&((in_stack_fffffffffffffce8.node)->
                       super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                       .
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                       .
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                       .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                       super_pod_value_holder<CTxMemPoolEntry>.space;
    }
    else {
      boost::multi_index::detail::
      bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
      ::operator++((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    }
  }
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  CTxMemPoolEntry::GetSharedTx(in_stack_fffffffffffffbd0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  CTransaction::GetHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  sVar5 = std::
          unordered_set<transaction_identifier<false>,_SaltedTxidHasher,_std::equal_to<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          ::count((unordered_set<transaction_identifier<false>,_SaltedTxidHasher,_std::equal_to<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)in_stack_fffffffffffffbd8.node,(key_type *)in_stack_fffffffffffffbd0);
  if (sVar5 != 0) {
    __assert_fail("!inBlock.count(iter->GetSharedTx()->GetHash())",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/miner.cpp"
                  ,0x169,
                  "void node::BlockAssembler::addPackageTxs(const CTxMemPool &, int &, int &)");
  }
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  CTxMemPoolEntry::GetSizeWithAncestors
            ((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_250 = CTxMemPoolEntry::GetModFeesWithAncestors
                        ((CTxMemPoolEntry *)
                         CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  CTxMemPoolEntry::GetSigOpCostWithAncestors
            ((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  if (bVar1) {
    boost::operators_impl::
    dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
    ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
                  *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    in_stack_fffffffffffffc88 =
         boost::operators_impl::
         dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
         ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
                       *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_250 = in_stack_fffffffffffffc88->nModFeesWithAncestors;
    in_stack_fffffffffffffc80 =
         (BlockAssembler *)
         boost::operators_impl::
         dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
         ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_const_node::CTxMemPoolModifiedEntry_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<node::CTxMemPoolModifiedEntry,_std::allocator<node::CTxMemPoolModifiedEntry>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_node::CTxMemPoolModifiedEntry,_long,_const_node::CTxMemPoolModifiedEntry_*,_const_node::CTxMemPoolModifiedEntry_&>_>_>
                       *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  }
  CVar6 = CFeeRate::GetFee((CFeeRate *)in_stack_fffffffffffffbe8.node,in_stack_fffffffffffffbe4);
  if (local_250 < CVar6) goto LAB_004a328a;
  bVar2 = TestPackage((BlockAssembler *)
                      CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                      (uint64_t)in_stack_fffffffffffffbd8.node,(int64_t)in_stack_fffffffffffffbd0);
  if (bVar2) {
    alreadyAdded = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbe8.node,
               (char *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    mempool_00 = (CTxMemPool *)
                 boost::multi_index::detail::
                 hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                 ::operator*((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                              *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    kernel::MemPoolLimits::NoLimits();
    in_stack_fffffffffffffbc8 = 0;
    calling_fn_name._M_str = (char *)in_stack_fffffffffffffc88;
    calling_fn_name._M_len = (size_t)in_stack_fffffffffffffc80;
    CTxMemPool::AssumeCalculateMemPoolAncestors
              ((CTxMemPool *)in_stack_fffffffffffffc50._M_node,calling_fn_name,
               (CTxMemPoolEntry *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
               (Limits *)mempool_00,SUB81((ulong)alreadyAdded >> 0x38,0));
    onlyUnconfirmed((BlockAssembler *)
                    CONCAT17(in_stack_fffffffffffffc2f,
                             CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)),
                    (setEntries *)in_stack_fffffffffffffc20.node);
    pVar10 = std::
             set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
             ::insert((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                       *)in_stack_fffffffffffffbd8.node,(value_type *)in_stack_fffffffffffffbd0);
    mapModifiedTx_00 = pVar10.first._M_node;
    in_stack_fffffffffffffc2f = pVar10.second;
    local_a8 = mapModifiedTx_00._M_node;
    local_a0 = in_stack_fffffffffffffc2f;
    in_stack_fffffffffffffc2e =
         TestPackageTransactions
                   ((BlockAssembler *)in_stack_fffffffffffffbe8.node,
                    (setEntries *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    if ((bool)in_stack_fffffffffffffc2e) {
      local_238 = 0;
      in_stack_fffffffffffffbf8 = &local_1f0;
      std::
      vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
      ::vector((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      SortForBlock((BlockAssembler *)in_stack_fffffffffffffc08._M_node,
                   (setEntries *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   (vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                    *)in_stack_fffffffffffffbf8);
      local_278 = (CTxMemPoolModifiedEntry *)0x0;
      while (in_stack_fffffffffffffbf0 = local_278,
            pCVar7 = (CTxMemPoolModifiedEntry *)
                     std::
                     vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                     ::size((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                             *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)),
            in_stack_fffffffffffffbf0 < pCVar7) {
        std::
        vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
        ::operator[]((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                      *)in_stack_fffffffffffffbd8.node,(size_type)in_stack_fffffffffffffbd0);
        AddToBlock(in_stack_fffffffffffffc80,in_stack_fffffffffffffce8);
        in_stack_fffffffffffffbe8.node =
             (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
              *)&stack0xffffffffffffffe8;
        std::
        vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
        ::operator[]((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                      *)in_stack_fffffffffffffbd8.node,(size_type)in_stack_fffffffffffffbd0);
        boost::multi_index::detail::
        ordered_index_impl<node::modifiedentry_iter,_node::CompareCTxMemPoolIter,_boost::multi_index::detail::nth_layer<1,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
        ::erase((ordered_index_impl<node::modifiedentry_iter,_node::CompareCTxMemPoolIter,_boost::multi_index::detail::nth_layer<1,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                 *)in_stack_fffffffffffffbe8.node,
                (key_param_type)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        local_278 = (CTxMemPoolModifiedEntry *)((long)&(local_278->iter).node + 1);
      }
      *in_RDX = *in_RDX + 1;
      in_stack_fffffffffffffbe4 =
           UpdatePackagesForAdded
                     (mempool_00,alreadyAdded,
                      (indexed_modified_transaction_set *)mapModifiedTx_00._M_node);
      *in_RCX = in_stack_fffffffffffffbe4 + *in_RCX;
      std::
      vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
      ::~vector((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                 *)in_stack_fffffffffffffbd8.node);
    }
    else if (bVar1) {
      boost::multi_index::
      multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
      ::get<ancestor_score>
                ((multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
                  *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      local_1c8 = local_118;
      position_00.node._4_4_ = in_stack_fffffffffffffbe4;
      position_00.node._0_4_ = in_stack_fffffffffffffbe0;
      in_stack_fffffffffffffc20 =
           boost::multi_index::detail::
           ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
           ::erase((ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                    *)in_stack_fffffffffffffbd0,position_00);
      boost::operators_impl::
      dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
      ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                    *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      CTxMemPoolEntry::GetSharedTx(in_stack_fffffffffffffbd0);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      pVar9 = std::
              set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              ::insert((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                        *)in_stack_fffffffffffffbd8.node,(value_type *)in_stack_fffffffffffffbd0);
      in_stack_fffffffffffffc08 = pVar9.first._M_node;
      in_stack_fffffffffffffc07 = pVar9.second;
      local_b8 = in_stack_fffffffffffffc08._M_node;
      local_b0 = in_stack_fffffffffffffc07;
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)
                 CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    }
    std::
    set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
    ::~set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
            *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  }
  else {
    if (bVar1) {
      boost::multi_index::
      multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
      ::get<ancestor_score>
                ((multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
                  *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      local_180 = local_118;
      position.node._4_4_ = in_stack_fffffffffffffbe4;
      position.node._0_4_ = in_stack_fffffffffffffbe0;
      boost::multi_index::detail::
      ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
      ::erase((ordered_index_impl<boost::multi_index::identity<node::CTxMemPoolModifiedEntry>,_CompareTxMemPoolEntryByAncestorFee,_boost::multi_index::detail::nth_layer<2,_node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>,_boost::mpl::v_item<ancestor_score,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
               *)in_stack_fffffffffffffbd0,position);
      boost::operators_impl::
      dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
      ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                    *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      CTxMemPoolEntry::GetSharedTx(in_stack_fffffffffffffbd0);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      pVar9 = std::
              set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              ::insert((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                        *)in_stack_fffffffffffffbd8.node,(value_type *)in_stack_fffffffffffffbd0);
      in_stack_fffffffffffffc50 = pVar9.first._M_node;
      in_stack_fffffffffffffc4f = pVar9.second;
      local_98 = in_stack_fffffffffffffc50._M_node;
      local_90 = in_stack_fffffffffffffc4f;
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)
                 CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    }
    local_238 = local_238 + 1;
    if ((1000 < local_238) &&
       ((ulong)(*(long *)(in_RDI + 0xb0) - *(long *)(in_RDI + 0xa0)) < *(ulong *)(in_RDI + 8))) {
LAB_004a328a:
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      boost::multi_index::
      multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
      ::~multi_index_container
                ((multi_index_container<node::CTxMemPoolModifiedEntry,_node::CTxMemPoolModifiedEntry_Indices,_std::allocator<node::CTxMemPoolModifiedEntry>_>
                  *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
  }
  goto LAB_004a24a2;
}

Assistant:

void BlockAssembler::addPackageTxs(const CTxMemPool& mempool, int& nPackagesSelected, int& nDescendantsUpdated)
{
    AssertLockHeld(mempool.cs);

    // mapModifiedTx will store sorted packages after they are modified
    // because some of their txs are already in the block
    indexed_modified_transaction_set mapModifiedTx;
    // Keep track of entries that failed inclusion, to avoid duplicate work
    std::set<Txid> failedTx;

    CTxMemPool::indexed_transaction_set::index<ancestor_score>::type::iterator mi = mempool.mapTx.get<ancestor_score>().begin();
    CTxMemPool::txiter iter;

    // Limit the number of attempts to add transactions to the block when it is
    // close to full; this is just a simple heuristic to finish quickly if the
    // mempool has a lot of entries.
    const int64_t MAX_CONSECUTIVE_FAILURES = 1000;
    int64_t nConsecutiveFailed = 0;

    while (mi != mempool.mapTx.get<ancestor_score>().end() || !mapModifiedTx.empty()) {
        // First try to find a new transaction in mapTx to evaluate.
        //
        // Skip entries in mapTx that are already in a block or are present
        // in mapModifiedTx (which implies that the mapTx ancestor state is
        // stale due to ancestor inclusion in the block)
        // Also skip transactions that we've already failed to add. This can happen if
        // we consider a transaction in mapModifiedTx and it fails: we can then
        // potentially consider it again while walking mapTx.  It's currently
        // guaranteed to fail again, but as a belt-and-suspenders check we put it in
        // failedTx and avoid re-evaluation, since the re-evaluation would be using
        // cached size/sigops/fee values that are not actually correct.
        /** Return true if given transaction from mapTx has already been evaluated,
         * or if the transaction's cached data in mapTx is incorrect. */
        if (mi != mempool.mapTx.get<ancestor_score>().end()) {
            auto it = mempool.mapTx.project<0>(mi);
            assert(it != mempool.mapTx.end());
            if (mapModifiedTx.count(it) || inBlock.count(it->GetSharedTx()->GetHash()) || failedTx.count(it->GetSharedTx()->GetHash())) {
                ++mi;
                continue;
            }
        }

        // Now that mi is not stale, determine which transaction to evaluate:
        // the next entry from mapTx, or the best from mapModifiedTx?
        bool fUsingModified = false;

        modtxscoreiter modit = mapModifiedTx.get<ancestor_score>().begin();
        if (mi == mempool.mapTx.get<ancestor_score>().end()) {
            // We're out of entries in mapTx; use the entry from mapModifiedTx
            iter = modit->iter;
            fUsingModified = true;
        } else {
            // Try to compare the mapTx entry to the mapModifiedTx entry
            iter = mempool.mapTx.project<0>(mi);
            if (modit != mapModifiedTx.get<ancestor_score>().end() &&
                    CompareTxMemPoolEntryByAncestorFee()(*modit, CTxMemPoolModifiedEntry(iter))) {
                // The best entry in mapModifiedTx has higher score
                // than the one from mapTx.
                // Switch which transaction (package) to consider
                iter = modit->iter;
                fUsingModified = true;
            } else {
                // Either no entry in mapModifiedTx, or it's worse than mapTx.
                // Increment mi for the next loop iteration.
                ++mi;
            }
        }

        // We skip mapTx entries that are inBlock, and mapModifiedTx shouldn't
        // contain anything that is inBlock.
        assert(!inBlock.count(iter->GetSharedTx()->GetHash()));

        uint64_t packageSize = iter->GetSizeWithAncestors();
        CAmount packageFees = iter->GetModFeesWithAncestors();
        int64_t packageSigOpsCost = iter->GetSigOpCostWithAncestors();
        if (fUsingModified) {
            packageSize = modit->nSizeWithAncestors;
            packageFees = modit->nModFeesWithAncestors;
            packageSigOpsCost = modit->nSigOpCostWithAncestors;
        }

        if (packageFees < m_options.blockMinFeeRate.GetFee(packageSize)) {
            // Everything else we might consider has a lower fee rate
            return;
        }

        if (!TestPackage(packageSize, packageSigOpsCost)) {
            if (fUsingModified) {
                // Since we always look at the best entry in mapModifiedTx,
                // we must erase failed entries so that we can consider the
                // next best entry on the next loop iteration
                mapModifiedTx.get<ancestor_score>().erase(modit);
                failedTx.insert(iter->GetSharedTx()->GetHash());
            }

            ++nConsecutiveFailed;

            if (nConsecutiveFailed > MAX_CONSECUTIVE_FAILURES && nBlockWeight >
                    m_options.nBlockMaxWeight - m_options.coinbase_max_additional_weight) {
                // Give up if we're close to full and haven't succeeded in a while
                break;
            }
            continue;
        }

        auto ancestors{mempool.AssumeCalculateMemPoolAncestors(__func__, *iter, CTxMemPool::Limits::NoLimits(), /*fSearchForParents=*/false)};

        onlyUnconfirmed(ancestors);
        ancestors.insert(iter);

        // Test if all tx's are Final
        if (!TestPackageTransactions(ancestors)) {
            if (fUsingModified) {
                mapModifiedTx.get<ancestor_score>().erase(modit);
                failedTx.insert(iter->GetSharedTx()->GetHash());
            }
            continue;
        }

        // This transaction will make it in; reset the failed counter.
        nConsecutiveFailed = 0;

        // Package can be added. Sort the entries in a valid order.
        std::vector<CTxMemPool::txiter> sortedEntries;
        SortForBlock(ancestors, sortedEntries);

        for (size_t i = 0; i < sortedEntries.size(); ++i) {
            AddToBlock(sortedEntries[i]);
            // Erase from the modified set, if present
            mapModifiedTx.erase(sortedEntries[i]);
        }

        ++nPackagesSelected;

        // Update transactions that depend on each of these
        nDescendantsUpdated += UpdatePackagesForAdded(mempool, ancestors, mapModifiedTx);
    }
}